

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_metadata.hpp
# Opt level: O0

void __thiscall
boost::python::objects::register_base_of<SpikesConsumer_python>::operator()
          (register_base_of<SpikesConsumer_python> *this,SpikesConsumer *param_2)

{
  SpikesConsumer *in_RSI;
  SpikesConsumer_python *in_RDI;
  undefined1 unaff_retaddr;
  
  register_dynamic_id<SpikesConsumer>(in_RSI);
  register_conversion<SpikesConsumer_python,SpikesConsumer>((bool)unaff_retaddr,in_RDI,in_RSI);
  register_downcast<SpikesConsumer>(0);
  return;
}

Assistant:

inline void operator()(Base*) const
    {
        BOOST_MPL_ASSERT_NOT((boost::python::detail::is_same<Base,Derived>));
        
        // Register the Base class
        register_dynamic_id<Base>();

        // Register the up-cast
        register_conversion<Derived,Base>(false);

        // Register the down-cast, if appropriate.
        this->register_downcast((Base*)0, boost::python::detail::is_polymorphic<Base>());
    }